

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BSA_SpikeEncodingSynapse.cpp
# Opt level: O0

void __thiscall BSA_SpikeEncodingSynapse::update(BSA_SpikeEncodingSynapse *this)

{
  double dVar1;
  int __x;
  reference ppEVar2;
  value_type pEVar4;
  reference pvVar5;
  reference pvVar6;
  long in_RDI;
  vector<double,_std::allocator<double>_> *this_00;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  int j_1;
  int j;
  double error2;
  double error1;
  int i;
  double currentTime;
  value_type_conflict3 *in_stack_ffffffffffffff68;
  deque<double,_std::allocator<double>_> *in_stack_ffffffffffffff70;
  BSA_SpikeEncodingSynapse *in_stack_ffffffffffffff80;
  Logging *in_stack_ffffffffffffff90;
  int local_40;
  int local_2c;
  double local_28;
  double local_20;
  int local_14;
  reference pvVar3;
  
  Clock::getCurrentTime(*(Clock **)(in_RDI + 0x68));
  resetOutput(in_stack_ffffffffffffff80);
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x88); local_14 = local_14 + 1) {
    ppEVar2 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                        ((vector<Event_*,_std::allocator<Event_*>_> *)(*(long *)(in_RDI + 8) + 8),
                         (long)local_14);
    if ((*ppEVar2)->type == Value) {
      std::
      vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
      ::operator[]((vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                    *)(in_RDI + 0x50),(long)local_14);
      std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                ((vector<Event_*,_std::allocator<Event_*>_> *)(*(long *)(in_RDI + 8) + 8),
                 (long)local_14);
      std::deque<double,_std::allocator<double>_>::push_back
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      std::
      vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
      ::operator[]((vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                    *)(in_RDI + 0x50),(long)local_14);
      std::deque<double,_std::allocator<double>_>::pop_front(in_stack_ffffffffffffff70);
      local_20 = 0.0;
      local_28 = 0.0;
      for (local_2c = 0; (double)local_2c < **(double **)(in_RDI + 0x18); local_2c = local_2c + 1) {
        std::
        vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
        ::operator[]((vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                      *)(in_RDI + 0x50),(long)local_14);
        std::deque<double,_std::allocator<double>_>::operator[]
                  (in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68);
        this_00 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x38);
        std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)local_2c);
        std::abs((int)this_00);
        local_20 = extraout_XMM0_Qa + local_20;
        pvVar3 = std::
                 vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x50),(long)local_14);
        __x = (int)pvVar3;
        std::deque<double,_std::allocator<double>_>::operator[]
                  (in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68);
        std::abs(__x);
        local_28 = extraout_XMM0_Qa_00 + local_28;
      }
      if (local_28 - *(double *)(*(long *)(in_RDI + 0x18) + 8) < local_20) {
        pEVar4 = (value_type)operator_new(0x18);
        NoEvent::NoEvent((NoEvent *)in_stack_ffffffffffffff90);
        ppEVar2 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                            ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x70),
                             (long)local_14);
        *ppEVar2 = pEVar4;
      }
      else {
        pEVar4 = (value_type)operator_new(0x28);
        SpikeEvent::SpikeEvent((SpikeEvent *)in_stack_ffffffffffffff90);
        ppEVar2 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                            ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x70),
                             (long)local_14);
        *ppEVar2 = pEVar4;
        ppEVar2 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                            ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x70),
                             (long)local_14);
        (**(*ppEVar2)->_vptr_Event)(0x408c200000000000);
        in_stack_ffffffffffffff90 = *(Logging **)(in_RDI + 0x90);
        ppEVar2 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                            ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x70),
                             (long)local_14);
        Logging::logEvent(in_stack_ffffffffffffff90,in_RDI,local_14,(*ppEVar2)->type);
        for (local_40 = 0; (double)local_40 < **(double **)(in_RDI + 0x18); local_40 = local_40 + 1)
        {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x38),
                              (long)local_40);
          dVar1 = *pvVar5;
          std::
          vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
          ::operator[]((vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                        *)(in_RDI + 0x50),(long)local_14);
          pvVar6 = std::deque<double,_std::allocator<double>_>::operator[]
                             (in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68);
          *pvVar6 = *pvVar6 - dVar1;
        }
      }
      in_stack_ffffffffffffff70 = *(deque<double,_std::allocator<double>_> **)(in_RDI + 0x10);
      ppEVar2 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                          ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x70),
                           (long)local_14);
      (*(code *)(in_stack_ffffffffffffff70->super__Deque_base<double,_std::allocator<double>_>).
                _M_impl.super__Deque_impl_data._M_map[5])
                (in_stack_ffffffffffffff70,local_14,*ppEVar2);
    }
  }
  return;
}

Assistant:

void BSA_SpikeEncodingSynapse::update() {
    double currentTime = clock->getCurrentTime();
    resetOutput();
    for(int i = 0; i < inputSize; i++) {
        if(from_population->output[i]->type == EventType::Value) {
            input[i].push_back(static_cast<ValueEvent*>(from_population->output[i])->value);
            input[i].pop_front();
            double error1 = 0;
            double error2 = 0;
            // Ben's Spiker Algorithm
            for(int j = 0; j < param->filter_length; j++) {
                error1 += abs(input[i][j] - filter[j]);
                error2 += abs(input[i][j]);
            }
            if(error1 <= (error2 - param->threshold)) {
                output[i] = new SpikeEvent();
                output[i]->setWeight(900.0);
                logger->logEvent((long)this, i, output[i]->type);
                for(int j = 0; j < param->filter_length; j++) {
                    input[i][j] -= filter[j];
                }
            }
            else {
                output[i] = new NoEvent();
            }
            to_population->setInput(i, output[i]);
        }
    }
}